

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive_buffer.cpp
# Opt level: O0

span<char> __thiscall libtorrent::aux::receive_buffer::reserve(receive_buffer *this,int size)

{
  int iVar1;
  difference_type dVar2;
  int *piVar3;
  char *p;
  span<char> sVar4;
  span<char> local_88;
  sliding_average<long,_20L> local_78;
  span<const_char> local_50;
  undefined1 local_40 [8];
  buffer new_buffer;
  int new_size;
  int size_local;
  receive_buffer *this_local;
  
  dVar2 = aux::buffer::size(&this->m_recv_buffer);
  if ((int)dVar2 < this->m_recv_end + size) {
    new_buffer.m_size._4_4_ = this->m_recv_end + size;
    piVar3 = ::std::max<int>((int *)((long)&new_buffer.m_size + 4),&this->m_packet_size);
    iVar1 = *piVar3;
    p = aux::buffer::data(&this->m_recv_buffer);
    span<const_char>::span(&local_50,p,(long)this->m_recv_end);
    aux::buffer::buffer((buffer *)local_40,(long)iVar1,local_50);
    aux::buffer::operator=(&this->m_recv_buffer,(buffer *)local_40);
    sliding_average<long,_20L>::sliding_average(&local_78);
    (this->m_watermark).m_mean = local_78.m_mean;
    (this->m_watermark).m_average_deviation = local_78.m_average_deviation;
    (this->m_watermark).m_num_samples = local_78.m_num_samples;
    aux::buffer::~buffer((buffer *)local_40);
  }
  span<char>::span<libtorrent::aux::buffer,char,void>(&local_88,&this->m_recv_buffer);
  sVar4 = span<char>::subspan(&local_88,(long)this->m_recv_end,(long)size);
  return sVar4;
}

Assistant:

span<char> receive_buffer::reserve(int const size)
{
	INVARIANT_CHECK;
	TORRENT_ASSERT(size > 0);
	TORRENT_ASSERT(m_recv_pos >= 0);

	// normalize() must be called before receiving more data
	TORRENT_ASSERT(m_recv_start == 0);

	if (int(m_recv_buffer.size()) < m_recv_end + size)
	{
		int const new_size = std::max(m_recv_end + size, m_packet_size);
		buffer new_buffer(new_size, {m_recv_buffer.data(), m_recv_end});
		m_recv_buffer = std::move(new_buffer);

		// since we just increased the size of the buffer, reset the watermark to
		// start at our new size (avoid flapping the buffer size)
		m_watermark = {};
	}

	return span<char>(m_recv_buffer).subspan(m_recv_end, size);
}